

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void getPU(double *A,int M,int N,int *ipiv,double *P,double *U)

{
  void *__ptr;
  long lVar1;
  void *__ptr_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  
  __ptr = malloc((long)M * 4);
  if (0 < M) {
    uVar5 = 0;
    do {
      *(int *)((long)__ptr + (long)ipiv[uVar5] * 4) = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while ((uint)M != uVar5);
  }
  iVar3 = N;
  if (M < N) {
    iVar3 = M;
  }
  lVar1 = (long)iVar3;
  __ptr_00 = malloc(M * lVar1 * 8);
  iVar3 = M - N;
  if (iVar3 == 0) {
    if (0 < M && __ptr_00 != (void *)0x0) {
      sVar11 = 0;
      uVar4 = 1;
      uVar9 = 1;
      uVar12 = 0;
      uVar5 = (ulong)(uint)M;
      pvVar7 = __ptr_00;
      do {
        if (sVar11 != 0) {
          memcpy((void *)((long)__ptr_00 + uVar12 * 8),A + uVar12,sVar11);
        }
        *(undefined8 *)((long)pvVar7 + uVar12 * 8) = 0x3ff0000000000000;
        if (uVar9 < (uint)M) {
          memset((void *)((long)__ptr_00 + (ulong)uVar4 * 8),0,(ulong)((int)uVar5 - 2) * 8 + 8);
        }
        pvVar7 = (void *)((long)pvVar7 + 8);
        uVar12 = (ulong)(uint)((int)uVar12 + M);
        uVar4 = uVar4 + M + 1;
        sVar11 = sVar11 + 8;
        uVar9 = uVar9 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    if (0 < M && U != (double *)0x0) {
      uVar5 = (ulong)(uint)M;
      uVar12 = 0;
      pdVar8 = U;
      uVar9 = uVar5;
      do {
        if (uVar12 != 0) {
          memset(U + (uint)((int)uVar12 * M),0,uVar12 * 8);
        }
        uVar2 = 0;
        do {
          pdVar8[uVar2] = A[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar9 != uVar2);
        uVar12 = uVar12 + 1;
        pdVar8 = pdVar8 + uVar5 + 1;
        A = A + uVar5 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar12 != uVar5);
    }
  }
  else if (iVar3 == 0 || M < N) {
    if (M < N) {
      uVar5 = (ulong)(uint)M;
      if (0 < M && __ptr_00 != (void *)0x0) {
        iVar3 = -2;
        uVar12 = 1;
        sVar11 = 0;
        uVar2 = 0;
        iVar10 = 0;
        uVar9 = 0;
        do {
          if (uVar9 != 0) {
            memcpy((void *)((long)__ptr_00 + uVar2 * 8),A + iVar10,sVar11);
          }
          *(undefined8 *)((long)__ptr_00 + (ulong)((int)uVar12 - 1) * 8) = 0x3ff0000000000000;
          uVar9 = uVar9 + 1;
          if (uVar9 < uVar5) {
            memset((void *)((long)__ptr_00 + uVar12 * 8),0,(ulong)(uint)(M + iVar3) * 8 + 8);
          }
          iVar3 = iVar3 + -1;
          uVar12 = (ulong)(uint)((int)uVar12 + M + 1);
          iVar10 = iVar10 + N;
          uVar2 = (ulong)(uint)((int)uVar2 + M);
          sVar11 = sVar11 + 8;
        } while (uVar5 != uVar9);
      }
      if (0 < M && U != (double *)0x0) {
        lVar6 = (long)N;
        uVar9 = (ulong)(uint)N;
        uVar12 = 0;
        pdVar8 = U;
        do {
          if (uVar12 != 0) {
            memset(U + (int)uVar12 * N,0,uVar12 * 8);
          }
          if ((long)uVar12 < lVar6) {
            uVar2 = 0;
            do {
              pdVar8[uVar2] = A[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar9 != uVar2);
          }
          uVar12 = uVar12 + 1;
          A = A + lVar6 + 1;
          pdVar8 = pdVar8 + lVar6 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar12 != uVar5);
      }
    }
  }
  else {
    if (__ptr_00 != (void *)0x0) {
      if (0 < N) {
        sVar11 = 0;
        uVar4 = 1;
        uVar9 = 1;
        uVar12 = 0;
        uVar5 = (ulong)(uint)N;
        pvVar7 = __ptr_00;
        do {
          if (sVar11 != 0) {
            memcpy((void *)((long)__ptr_00 + uVar12 * 8),A + uVar12,sVar11);
          }
          *(undefined8 *)((long)pvVar7 + uVar12 * 8) = 0x3ff0000000000000;
          if (uVar9 < (uint)N) {
            memset((void *)((long)__ptr_00 + (ulong)uVar4 * 8),0,(ulong)((int)uVar5 - 2) * 8 + 8);
          }
          pvVar7 = (void *)((long)pvVar7 + 8);
          uVar12 = (ulong)(uint)((int)uVar12 + N);
          uVar4 = uVar4 + N + 1;
          sVar11 = sVar11 + 8;
          uVar9 = uVar9 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      memcpy((void *)((long)__ptr_00 + (ulong)(uint)(N * N) * 8),A + (uint)(N * N),
             (long)N * (long)iVar3 * 8);
    }
    if (0 < N && U != (double *)0x0) {
      uVar5 = (ulong)(uint)N;
      uVar12 = 0;
      pdVar8 = U;
      uVar9 = uVar5;
      do {
        if (uVar12 != 0) {
          memset(U + (uint)((int)uVar12 * N),0,uVar12 * 8);
        }
        uVar2 = 0;
        do {
          pdVar8[uVar2] = A[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar9 != uVar2);
        uVar12 = uVar12 + 1;
        pdVar8 = pdVar8 + uVar5 + 1;
        A = A + uVar5 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar12 != uVar5);
    }
  }
  if (0 < M) {
    uVar5 = 0;
    do {
      memcpy(P,(void *)((long)__ptr_00 + *(int *)((long)__ptr + uVar5 * 4) * lVar1 * 8),lVar1 * 8);
      uVar5 = uVar5 + 1;
      P = P + lVar1;
    } while ((uint)M != uVar5);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void getPU(double *A, int M, int N, int *ipiv, double *P,double *U) {
	int i,j,K;
	int *ipivt;
	double *L;

	ipivt = (int*)malloc(sizeof(int)*M);

	for (i = 0; i < M; ++i) {
		ipivt[ipiv[i]] = i;
	}

	if (M > N) {
		K = N;
	}
	else {
		K = M;
	}

	L = (double*)malloc(sizeof(double)*M*K);

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}

	for (i = 0; i < M; ++i) {
		memcpy(P + i*K, L + ipivt[i] * K, sizeof(double)*K);
	}


	free(ipivt);
	free(L);
}